

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O2

ON_Curve * ON_TrimCurve(ON_Curve *curve,ON_Interval trim_parameters)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  ON_Object *p;
  ON_Object *p_00;
  ON_PolyCurve *this;
  ON_PolyCurve *this_00;
  ON_Curve *c;
  undefined4 extraout_var_01;
  _func_int **pp_Var5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_Interval trim_parameters_local;
  ON_Interval curve_domain;
  ON_Interval sdom;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  dVar8 = trim_parameters.m_t[1];
  trim_parameters_local.m_t[0] = trim_parameters.m_t[0];
  trim_parameters_local.m_t[1] = dVar8;
  (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  curve_domain.m_t[1] = dVar8;
  bVar1 = ON_Interval::IsDecreasing(&trim_parameters_local);
  ON_Interval::Intersection(&trim_parameters_local,&curve_domain);
  if (bVar1) {
    ON_Interval::Swap(&trim_parameters_local);
    pdVar4 = ON_Interval::operator[](&trim_parameters_local,0);
    dVar8 = *pdVar4;
    iVar2 = 1;
    dVar6 = ON_Interval::operator[](&curve_domain,1);
    pdVar4 = ON_Interval::operator[](&trim_parameters_local,1);
    dVar9 = *pdVar4;
    dVar7 = ON_Interval::operator[](&curve_domain,0);
    if ((dVar8 != dVar6) || (NAN(dVar8) || NAN(dVar6))) {
      if ((dVar9 != dVar7) || (NAN(dVar9) || NAN(dVar7))) {
        bVar1 = ON_Interval::IsDecreasing(&trim_parameters_local);
        if (!bVar1) {
          return (ON_Curve *)0x0;
        }
        goto LAB_0044defa;
      }
    }
    else {
      if ((dVar9 == dVar7) && (!NAN(dVar9) && !NAN(dVar7))) {
        return (ON_Curve *)0x0;
      }
      iVar2 = 0;
    }
    dVar8 = ON_Interval::operator[](&curve_domain,iVar2);
    pdVar4 = ON_Interval::operator[](&trim_parameters_local,iVar2);
    *pdVar4 = dVar8;
  }
LAB_0044defa:
  bVar1 = ON_Interval::IsDecreasing(&trim_parameters_local);
  if ((bVar1) &&
     (iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(curve),
     (char)iVar2 != '\0')) {
    iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
    p = (ON_Object *)CONCAT44(extraout_var,iVar2);
    pdVar4 = ON_Interval::operator[](&trim_parameters_local,0);
    dVar8 = *pdVar4;
    dVar9 = ON_Interval::operator[](&curve_domain,1);
    ON_Interval::ON_Interval(&sdom,dVar8,dVar9);
    iVar2 = (*p->_vptr_ON_Object[0x3c])(p);
    if ((char)iVar2 == '\0') {
      pp_Var5 = p->_vptr_ON_Object;
    }
    else {
      iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
      p_00 = (ON_Object *)CONCAT44(extraout_var_00,iVar2);
      dVar8 = ON_Interval::operator[](&curve_domain,0);
      pdVar4 = ON_Interval::operator[](&trim_parameters_local,1);
      ON_Interval::ON_Interval(&sdom,dVar8,*pdVar4);
      iVar2 = (*p_00->_vptr_ON_Object[0x3c])(p_00);
      if ((char)iVar2 != '\0') {
        this = ON_PolyCurve::Cast(p);
        if (this == (ON_PolyCurve *)0x0) {
          this = (ON_PolyCurve *)operator_new(0x40);
          ON_PolyCurve::ON_PolyCurve(this);
          ON_PolyCurve::Append(this,(ON_Curve *)p);
        }
        this_00 = ON_PolyCurve::Cast(p_00);
        if (this_00 == (ON_PolyCurve *)0x0) {
          ON_PolyCurve::Append(this,(ON_Curve *)p_00);
        }
        else {
          for (iVar2 = 0; iVar3 = ON_PolyCurve::Count(this_00), iVar2 < iVar3; iVar2 = iVar2 + 1) {
            sdom = ON_PolyCurve::SegmentDomain(this_00,iVar2);
            c = ON_PolyCurve::HarvestSegment(this_00,iVar2);
            pdVar4 = ON_Interval::operator[](&sdom,0);
            dVar8 = *pdVar4;
            pdVar4 = ON_Interval::operator[](&sdom,1);
            (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(dVar8,*pdVar4,c);
            ON_PolyCurve::Append(this,c);
          }
          (*p_00->_vptr_ON_Object[4])();
        }
        pdVar4 = ON_Interval::operator[](&trim_parameters_local,0);
        dVar8 = *pdVar4;
        pdVar4 = ON_Interval::operator[](&trim_parameters_local,1);
        dVar9 = *pdVar4;
        dVar6 = ON_Interval::Length(&curve_domain);
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (dVar8,dVar9 + dVar6,this);
        return &this->super_ON_Curve;
      }
      (*p->_vptr_ON_Object[4])(p);
      pp_Var5 = p_00->_vptr_ON_Object;
      p = p_00;
    }
  }
  else {
    bVar1 = ON_Interval::IsIncreasing(&trim_parameters_local);
    if (!bVar1) {
      return (ON_Curve *)0x0;
    }
    iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
    p = (ON_Object *)CONCAT44(extraout_var_01,iVar2);
    if (p == (ON_Object *)0x0) {
      return (ON_Curve *)0x0;
    }
    iVar2 = (*p->_vptr_ON_Object[0x3c])(p,&trim_parameters_local);
    if ((char)iVar2 != '\0') {
      return (ON_Curve *)p;
    }
    pp_Var5 = p->_vptr_ON_Object;
  }
  (*pp_Var5[4])(p);
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_TrimCurve( 
            const ON_Curve& curve,
            ON_Interval trim_parameters
            )
{
  ON_Curve* trimmed_curve = 0;

  const ON_Interval curve_domain = curve.Domain();
  bool bDecreasing = trim_parameters.IsDecreasing();
  trim_parameters.Intersection( curve_domain ); // trim_parameters will be increasing or empty
  if ( bDecreasing )
  {
    trim_parameters.Swap();
    if ( trim_parameters[0] == curve_domain[1] )
    {
      if ( trim_parameters[1] == curve_domain[0] )
        return 0;
      trim_parameters[0] = curve_domain[0];
    }
    else if ( trim_parameters[1] == curve_domain[0] )
      trim_parameters[1] = curve_domain[1];
    else if ( !trim_parameters.IsDecreasing() )
      return 0;
  }

  if ( trim_parameters.IsDecreasing() && curve.IsClosed() )
  {
    ON_Curve* left_crv = curve.DuplicateCurve();
    if ( !left_crv->Trim(ON_Interval(trim_parameters[0],curve_domain[1])) )
    {
      delete left_crv;
      return 0;
    }
    ON_Curve* right_crv = curve.DuplicateCurve();
    if ( !right_crv->Trim(ON_Interval(curve_domain[0],trim_parameters[1])) )
    {
      delete left_crv;
      delete right_crv;
      return 0;
    }
    ON_PolyCurve* polycurve = ON_PolyCurve::Cast(left_crv);
    if ( polycurve == nullptr )
    {
      polycurve = new ON_PolyCurve();      
      polycurve->Append( left_crv );
    }

    ON_PolyCurve* ptmp = ON_PolyCurve::Cast(right_crv);
    if ( ptmp )
    {
      int i;
      for ( i = 0; i < ptmp->Count(); i++ )
      {
        ON_Interval sdom = ptmp->SegmentDomain(i);
        ON_Curve* segment = ptmp->HarvestSegment(i);
        segment->SetDomain(sdom[0],sdom[1]); // to keep relative parameterization unchanged
        polycurve->Append( segment );
      }
      delete right_crv;
      ptmp = 0;
      right_crv = 0;
    }
    else
    {
      polycurve->Append( right_crv );
    }

    polycurve->SetDomain( trim_parameters[0], trim_parameters[1] + curve_domain.Length() );

    trimmed_curve = polycurve;
  }
  else if ( trim_parameters.IsIncreasing() )
  {
    trimmed_curve = curve.DuplicateCurve();
    if(!trimmed_curve || !trimmed_curve->Trim(trim_parameters) )
    {
      delete trimmed_curve;
      trimmed_curve = 0;
    }
  }

  return trimmed_curve;
}